

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

string * __thiscall
libtorrent::aux::latin1_utf8_abi_cxx11_(string *__return_storage_ptr__,aux *this,span<const_char> s)

{
  char *pcVar1;
  int32_t cp;
  char c;
  char *__end2;
  char *__begin2;
  span<const_char> *__range2;
  undefined1 local_20 [8];
  span<const_char> s_local;
  string *ret;
  
  s_local.m_ptr = s.m_ptr;
  local_20 = (undefined1  [8])this;
  s_local.m_len = (difference_type)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2 = span<const_char>::begin((span<const_char> *)local_20);
  pcVar1 = span<const_char>::end((span<const_char> *)local_20);
  for (; __end2 != pcVar1; __end2 = __end2 + 1) {
    append_utf8_codepoint(__return_storage_ptr__,(uint)(byte)*__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string latin1_utf8(span<char const> s)
	{
		std::string ret;
		for (char const c : s)
		{
			std::int32_t const cp = static_cast<unsigned char>(c);
			append_utf8_codepoint(ret, cp);
		}
		return ret;
	}